

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.c
# Opt level: O2

bbox * get_quad_bbox(bbox *__return_storage_ptr__,void *primitive_data,size_t index)

{
  quad *quad;
  undefined4 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  bbox a;
  bbox b;
  long lVar4;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vec3 vVar12;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_44;
  undefined4 uStack_40;
  
  lVar4 = index * 0x48;
  quad = (quad *)((long)primitive_data + lVar4);
  uVar2 = *(undefined8 *)((long)primitive_data + lVar4);
  uVar1 = *(undefined4 *)((long)primitive_data + lVar4 + 8);
  uStack_44 = (undefined4)uVar2;
  uStack_40 = (undefined4)((ulong)uVar2 >> 0x20);
  vVar12 = get_quad_p1(quad);
  fVar5 = vVar12._[2];
  auVar10._8_4_ = extraout_XMM0_Dc;
  auVar10._0_8_ = vVar12._._0_8_;
  auVar10._12_4_ = extraout_XMM0_Dd;
  vVar12 = get_quad_p2(quad);
  fVar6 = vVar12._[2];
  auVar11._8_4_ = extraout_XMM0_Dc_00;
  auVar11._0_8_ = vVar12._._0_8_;
  auVar11._12_4_ = extraout_XMM0_Dd_00;
  vVar12 = get_quad_p3(quad);
  fVar7 = vVar12._[2];
  fVar9 = fVar6;
  if (fVar7 <= fVar6) {
    fVar9 = fVar7;
  }
  if (fVar6 <= fVar7) {
    fVar6 = fVar7;
  }
  auVar8._8_4_ = extraout_XMM0_Dc_01;
  auVar8._0_8_ = vVar12._._0_8_;
  auVar8._12_4_ = extraout_XMM0_Dd_01;
  auVar8 = minps(auVar11,auVar8);
  auVar8 = minps(auVar10,auVar8);
  fVar7 = fVar5;
  if (fVar9 <= fVar5) {
    fVar7 = fVar9;
  }
  auVar3._8_4_ = extraout_XMM0_Dc_01;
  auVar3._0_8_ = vVar12._._0_8_;
  auVar3._12_4_ = extraout_XMM0_Dd_01;
  auVar11 = maxps(auVar11,auVar3);
  auVar10 = maxps(auVar10,auVar11);
  if (fVar5 <= fVar6) {
    fVar5 = fVar6;
  }
  uStack_5c = auVar10._0_4_;
  uStack_58 = auVar10._4_4_;
  b.max._[2] = fVar5;
  b.max._[1] = (real_t)uStack_58;
  b.max._[0] = (real_t)uStack_5c;
  b.min._[2] = fVar7;
  a.max._[2] = (real_t)uVar1;
  a.max._[1] = (real_t)uStack_40;
  a.max._[0] = (real_t)uStack_44;
  a.min._[2] = (real_t)uVar1;
  a.min._[0] = (real_t)(int)uVar2;
  a.min._[1] = (real_t)(int)((ulong)uVar2 >> 0x20);
  b.min._[0] = (real_t)(int)auVar8._0_8_;
  b.min._[1] = (real_t)(int)((ulong)auVar8._0_8_ >> 0x20);
  union_bbox(a,b);
  return __return_storage_ptr__;
}

Assistant:

static struct bbox get_quad_bbox(void* primitive_data, size_t index) {
    const struct quad* quad = &((const struct quad*)primitive_data)[index];
    return
        union_bbox(point_bbox(quad->p0),
        union_bbox(point_bbox(get_quad_p1(quad)),
        union_bbox(point_bbox(get_quad_p2(quad)),
            point_bbox(get_quad_p3(quad)))));
}